

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.hpp
# Opt level: O2

void __thiscall
pico_tree::
kd_tree<pico_tree::space_map<pico_tree::point_map<double,2ul>>,pico_tree::metric_l2_squared,int>::
search_nearest<pico_tree::internal::point_wrapper<pico_tree::point_map<double,2ul>>,pico_tree::internal::search_nn<pico_tree::neighbor<int,double>>>
          (kd_tree<pico_tree::space_map<pico_tree::point_map<double,2ul>>,pico_tree::metric_l2_squared,int>
           *this,point_type *point,search_nn<pico_tree::neighbor<int,_double>_> *visitor)

{
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  local_38;
  
  local_38.indices_ = (vector<int,_std::allocator<int>_> *)(this + 0x18);
  local_38.node_box_offset_.elems_._M_elems[0] = 0.0;
  local_38.node_box_offset_.elems_._M_elems[1] = 0.0;
  local_38.space_.space_ = (space_type *)this;
  local_38.query_.point_ = point;
  local_38.visitor_ = visitor;
  internal::
  search_nearest_euclidean<pico_tree::internal::space_wrapper<pico_tree::space_map<pico_tree::point_map<double,_2UL>_>_>,_pico_tree::metric_l2_squared,_pico_tree::internal::point_wrapper<pico_tree::point_map<double,_2UL>_>,_pico_tree::internal::search_nn<pico_tree::neighbor<int,_double>_>,_int>
  ::operator()(&local_38,*(node_type **)(this + 0x70));
  return;
}

Assistant:

inline void search_nearest(
      PointWrapper_ point, Visitor_& visitor, euclidean_space_tag) const {
    internal::search_nearest_euclidean<
        space_wrapper_type,
        Metric_,
        PointWrapper_,
        Visitor_,
        index_type>(
        space_wrapper_type(space_), metric_, data_.indices, point, visitor)(
        data_.root_node);
  }